

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

bool lest::is_number(text *arg)

{
  long lVar1;
  bool bVar2;
  text digits;
  allocator local_49;
  string local_48 [32];
  string local_28 [32];
  
  std::__cxx11::string::string(local_28,"0123456789",&local_49);
  std::__cxx11::string::string(local_48,local_28);
  std::__cxx11::string::_M_dispose();
  lVar1 = std::__cxx11::string::find_first_of((string *)arg,(ulong)local_48);
  if (lVar1 == -1) {
    bVar2 = false;
  }
  else {
    lVar1 = std::__cxx11::string::find_first_not_of((string *)arg,(ulong)local_48);
    bVar2 = lVar1 == -1;
  }
  std::__cxx11::string::_M_dispose();
  return bVar2;
}

Assistant:

inline bool is_number( text arg )
{
    const text digits = "0123456789";
    return text::npos != arg.find_first_of    ( digits )
        && text::npos == arg.find_first_not_of( digits );
}